

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O2

void UCNV_FROM_U_CALLBACK_SUBSTITUTE_63
               (void *context,UConverterFromUnicodeArgs *fromArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  if ((int)reason < 3) {
    if ((reason == UCNV_UNASSIGNED) &&
       (((((((codePoint - 0x200bU < 0x24 &&
             ((0xf8000001fU >> ((ulong)(codePoint - 0x200bU) & 0x3f) & 1) != 0)) ||
            (codePoint - 0x180bU < 4)) || ((codePoint - 0x115fU < 2 || (codePoint - 0x17b4U < 2))))
          || ((codePoint == 0xad || ((codePoint == 0x34f || (codePoint == 0x61c)))))) ||
         (codePoint == 0x3164 || (codePoint & 0xfffffff0U) == 0x2060)) ||
        (((((codePoint & 0xfffff000U) == 0xe0000 || (codePoint - 0x1d173U < 8)) ||
          ((codePoint & 0xfffffffcU) == 0x1bca0)) ||
         (((codePoint - 0xfff0U < 9 || (codePoint == 0xffa0)) ||
          ((codePoint == 0xfeff || ((codePoint & 0xfffffff0U) == 0xfe00)))))))))) {
      *err = U_ZERO_ERROR;
      return;
    }
    if ((context == (void *)0x0) || ((reason == UCNV_UNASSIGNED && (*context == 'i')))) {
      *err = U_ZERO_ERROR;
      ucnv_cbFromUWriteSub_63(fromArgs,0,err);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_SUBSTITUTE (
                  const void *context,
                  UConverterFromUnicodeArgs *fromArgs,
                  const UChar* codeUnits,
                  int32_t length,
                  UChar32 codePoint,
                  UConverterCallbackReason reason,
                  UErrorCode * err)
{
    (void)codeUnits;
    (void)length;
    if (reason <= UCNV_IRREGULAR)
    {
        if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
        {
            /*
             * Skip if the codepoint has unicode property of default ignorable.
             */
            *err = U_ZERO_ERROR;
        }
        else if (context == NULL || (*((char*)context) == UCNV_PRV_STOP_ON_ILLEGAL && reason == UCNV_UNASSIGNED))
        {
            *err = U_ZERO_ERROR;
            ucnv_cbFromUWriteSub(fromArgs, 0, err);
        }
        /* else the caller must have set the error code accordingly. */
    }
    /* else ignore the reset, close and clone calls. */
}